

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

uint8_t * __thiscall NodeBTree::parseData(NodeBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar1 = *data;
  key->m_flags = (uint)bVar1;
  uVar7 = (ulong)data[1];
  pbVar3 = data + 2;
  if ((char)data[1] < '\0') {
    uVar6 = 0x80;
    do {
      uVar5 = (uVar7 - uVar6) * 0x100;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      uVar7 = bVar2 | uVar5;
      uVar6 = uVar6 << 7;
    } while ((uVar5 & uVar6) != 0);
  }
  key->m_nodeIndex = (uint32_t)uVar7;
  uVar7 = (ulong)*pbVar3;
  pbVar4 = pbVar3 + 1;
  if ((char)*pbVar3 < '\0') {
    uVar6 = 0x80;
    do {
      uVar5 = (uVar7 - uVar6) * 0x100;
      bVar2 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      uVar7 = bVar2 | uVar5;
      uVar6 = uVar6 << 7;
    } while ((uVar5 & uVar6) != 0);
  }
  key->m_size1 = (uint32_t)uVar7;
  if ((bVar1 & 0xf) != 0) {
    bVar1 = *pbVar4;
    uVar7 = (ulong)bVar1;
    pbVar4 = pbVar4 + 1;
    if ((char)bVar1 < '\0') {
      uVar6 = 0x80;
      do {
        uVar5 = (uVar7 - uVar6) * 0x100;
        bVar1 = *pbVar4;
        pbVar4 = pbVar4 + 1;
        uVar7 = bVar1 | uVar5;
        uVar6 = uVar6 << 7;
      } while ((uVar5 & uVar6) != 0);
    }
  }
  key->m_size2 = (uint32_t)uVar7;
  uVar7 = 0;
  if (this->m_hasMultipleVolumes == true) {
    bVar1 = *pbVar4;
    uVar7 = (ulong)bVar1;
    pbVar4 = pbVar4 + 1;
    if ((char)bVar1 < '\0') {
      uVar6 = 0x80;
      do {
        uVar5 = (uVar7 - uVar6) * 0x100;
        bVar1 = *pbVar4;
        pbVar4 = pbVar4 + 1;
        uVar7 = bVar1 | uVar5;
        uVar6 = uVar6 << 7;
      } while ((uVar5 & uVar6) != 0);
    }
  }
  key->m_volumeIndex = (uint32_t)uVar7;
  uVar7 = (ulong)*pbVar4;
  pbVar3 = pbVar4 + 1;
  if ((char)*pbVar4 < '\0') {
    uVar6 = 0x80;
    do {
      uVar5 = (uVar7 - uVar6) * 0x100;
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      uVar7 = bVar1 | uVar5;
      uVar6 = uVar6 << 7;
    } while ((uVar5 & uVar6) != 0);
  }
  key->m_sectorIndex = (uint32_t)uVar7;
  return pbVar3;
}

Assistant:

const uint8_t* parseData(KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		key.setFlags(flags);
		
		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setNodeIndex(nodeIndex);

		const auto size1 = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setSize1(size1);
		
		// TODO: figure out
		const auto size2 = key.hasBits0123() ? static_cast<uint32_t>(decodeBitsAndAdvance(data)) : size1;
		key.setSize2(size2);
		
		if (m_hasMultipleVolumes) {
			const auto volumeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			key.setVolumeIndex(volumeIndex);
		} else {
			key.setVolumeIndex(0);
		}
		
		const auto sectorIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setSectorIndex(sectorIndex);
		
		return data;
	}